

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxFacts.cpp
# Opt level: O0

SyntaxKind slang::syntax::SyntaxFacts::getBinaryPropertyExpr(TokenKind kind)

{
  undefined4 local_c;
  TokenKind kind_local;
  
  if (kind == HashMinusHash) {
    local_c = FollowedByPropertyExpr;
  }
  else if (kind == HashEqualsHash) {
    local_c = FollowedByPropertyExpr;
  }
  else if (kind == OrMinusArrow) {
    local_c = ImplicationPropertyExpr;
  }
  else if (kind == OrEqualsArrow) {
    local_c = ImplicationPropertyExpr;
  }
  else if (kind == AndKeyword) {
    local_c = AndPropertyExpr;
  }
  else if (kind == IffKeyword) {
    local_c = IffPropertyExpr;
  }
  else if (kind == ImpliesKeyword) {
    local_c = ImpliesPropertyExpr;
  }
  else if (kind == OrKeyword) {
    local_c = OrPropertyExpr;
  }
  else if (kind == SUntilKeyword) {
    local_c = SUntilPropertyExpr;
  }
  else if (kind == SUntilWithKeyword) {
    local_c = SUntilWithPropertyExpr;
  }
  else if (kind == UntilKeyword) {
    local_c = UntilPropertyExpr;
  }
  else if (kind == UntilWithKeyword) {
    local_c = UntilWithPropertyExpr;
  }
  else {
    local_c = Unknown;
  }
  return local_c;
}

Assistant:

SyntaxKind SyntaxFacts::getBinaryPropertyExpr(TokenKind kind) {
    switch (kind) {
        case TokenKind::AndKeyword: return SyntaxKind::AndPropertyExpr;
        case TokenKind::OrKeyword: return SyntaxKind::OrPropertyExpr;
        case TokenKind::IffKeyword: return SyntaxKind::IffPropertyExpr;
        case TokenKind::UntilKeyword: return SyntaxKind::UntilPropertyExpr;
        case TokenKind::SUntilKeyword: return SyntaxKind::SUntilPropertyExpr;
        case TokenKind::UntilWithKeyword: return SyntaxKind::UntilWithPropertyExpr;
        case TokenKind::SUntilWithKeyword: return SyntaxKind::SUntilWithPropertyExpr;
        case TokenKind::ImpliesKeyword: return SyntaxKind::ImpliesPropertyExpr;
        case TokenKind::OrMinusArrow: return SyntaxKind::ImplicationPropertyExpr;
        case TokenKind::OrEqualsArrow: return SyntaxKind::ImplicationPropertyExpr;
        case TokenKind::HashMinusHash: return SyntaxKind::FollowedByPropertyExpr;
        case TokenKind::HashEqualsHash: return SyntaxKind::FollowedByPropertyExpr;
        default: return SyntaxKind::Unknown;
    }
}